

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

char * QTest::tcMessageType2String(MessageTypes type)

{
  MessageTypes type_local;
  char *local_8;
  
  switch(type) {
  case QDebug:
    local_8 = "QDEBUG";
    break;
  case QInfo:
    local_8 = "QINFO";
    break;
  case QWarning:
    local_8 = "QWARN";
    break;
  case QCritical:
    local_8 = "QCRITICAL";
    break;
  case QFatal:
    local_8 = "QFATAL";
    break;
  case Info:
    local_8 = "INFO";
    break;
  case Warn:
    local_8 = "WARNING";
    break;
  default:
    local_8 = "??????";
  }
  return local_8;
}

Assistant:

static const char *tcMessageType2String(QAbstractTestLogger::MessageTypes type)
    {
        switch (type) {
        case QAbstractTestLogger::QDebug:
            return "QDEBUG";
        case QAbstractTestLogger::QInfo:
            return "QINFO";
        case QAbstractTestLogger::QWarning:
            return "QWARN";
        case QAbstractTestLogger::QCritical:
            return "QCRITICAL";
        case QAbstractTestLogger::QFatal:
            return "QFATAL";
        case QAbstractTestLogger::Info:
            return "INFO";
        case QAbstractTestLogger::Warn:
            return "WARNING";
        }
        return "??????";
    }